

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Param::Param(Param *this,Generator *m,string *name)

{
  _Rb_tree_header *p_Var1;
  
  Const::Const(&this->super_Const,m,1,1,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002cbbd8;
  std::__cxx11::string::string((string *)&this->parameter_name_,(string *)name);
  this->param_type_ = RawType;
  (this->param_vars_width_)._M_h._M_buckets = &(this->param_vars_width_)._M_h._M_single_bucket;
  (this->param_vars_width_)._M_h._M_bucket_count = 1;
  (this->param_vars_width_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->param_vars_width_)._M_h._M_element_count = 0;
  (this->param_vars_width_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->param_vars_width_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->param_vars_width_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header;
  (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->param_params_)._M_h._M_buckets = &(this->param_params_)._M_h._M_single_bucket;
  (this->param_params_)._M_h._M_bucket_count = 1;
  (this->param_params_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->param_params_)._M_h._M_element_count = 0;
  (this->param_params_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->initial_value_).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->raw_str_value_).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->initial_raw_str_value_).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  this->enum_def_ = (Enum *)0x0;
  *(undefined8 *)((long)&(this->param_params_)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&this->parent_param_ + 1) = 0;
  (this->param_params_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->param_params_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Const).super_Var.type_ = Parameter;
  return;
}

Assistant:

Param::Param(Generator *m, std::string name)
    : Const(m, 1, 1, false), parameter_name_(std::move(name)), param_type_(ParamType::RawType) {
    // override the type value
    type_ = VarType::Parameter;
}